

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

int CMwrite_attr(CMConnection conn,CMFormat format,void *data,attr_list attrs)

{
  int iVar1;
  undefined8 in_RCX;
  char *in_RDX;
  CManager in_RSI;
  CManager_conflict cm;
  int ret;
  attr_list in_stack_000007e0;
  void *in_stack_000007e8;
  CMFormat in_stack_000007f0;
  CMConnection in_stack_000007f8;
  int line;
  
  line = (int)((ulong)in_RCX >> 0x20);
  IntCManager_lock(in_RSI,in_RDX,line);
  iVar1 = INT_CMwrite_attr(in_stack_000007f8,in_stack_000007f0,in_stack_000007e8,in_stack_000007e0);
  IntCManager_unlock(in_RSI,in_RDX,line);
  return iVar1;
}

Assistant:

extern int
CMwrite_attr ( CMConnection conn, CMFormat format, void *data, attr_list attrs )
{
	int ret;
	CManager cm = conn->cm;
	CManager_lock(cm);
	ret = INT_CMwrite_attr(conn, format, data, attrs);
	CManager_unlock(cm);
	return ret;
}